

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

void __thiscall jrtplib::RTPUDPv6Transmitter::AddLoopbackAddress(RTPUDPv6Transmitter *this)

{
  size_t *psVar1;
  bool bVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  undefined1 auVar5 [16];
  
  p_Var3 = (this->localIPs).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)&this->localIPs) {
    bVar2 = false;
    do {
      auVar5[0] = -(*(char *)&p_Var3[1]._M_next == in6addr_loopback);
      auVar5[1] = -(*(char *)((long)&p_Var3[1]._M_next + 1) == cRam0000000000140129);
      auVar5[2] = -(*(char *)((long)&p_Var3[1]._M_next + 2) == cRam000000000014012a);
      auVar5[3] = -(*(char *)((long)&p_Var3[1]._M_next + 3) == cRam000000000014012b);
      auVar5[4] = -(*(char *)((long)&p_Var3[1]._M_next + 4) == cRam000000000014012c);
      auVar5[5] = -(*(char *)((long)&p_Var3[1]._M_next + 5) == cRam000000000014012d);
      auVar5[6] = -(*(char *)((long)&p_Var3[1]._M_next + 6) == cRam000000000014012e);
      auVar5[7] = -(*(char *)((long)&p_Var3[1]._M_next + 7) == cRam000000000014012f);
      auVar5[8] = -(*(code *)&p_Var3[1]._M_prev == std::__throw_bad_array_new_length);
      auVar5[9] = -(*(char *)((long)&p_Var3[1]._M_prev + 1) == cRam0000000000140131);
      auVar5[10] = -(*(char *)((long)&p_Var3[1]._M_prev + 2) == cRam0000000000140132);
      auVar5[0xb] = -(*(char *)((long)&p_Var3[1]._M_prev + 3) == cRam0000000000140133);
      auVar5[0xc] = -(*(char *)((long)&p_Var3[1]._M_prev + 4) == cRam0000000000140134);
      auVar5[0xd] = -(*(char *)((long)&p_Var3[1]._M_prev + 5) == cRam0000000000140135);
      auVar5[0xe] = -(*(char *)((long)&p_Var3[1]._M_prev + 6) == cRam0000000000140136);
      auVar5[0xf] = -(*(char *)((long)&p_Var3[1]._M_prev + 7) == cRam0000000000140137);
      if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf
                  ) == 0xffff) {
        bVar2 = true;
      }
      if (bVar2) {
        return;
      }
      p_Var3 = p_Var3->_M_next;
    } while (p_Var3 != (_List_node_base *)&this->localIPs);
    if (bVar2) {
      return;
    }
  }
  p_Var4 = (_List_node_base *)operator_new(0x20);
  p_Var3 = (_List_node_base *)
           CONCAT17(cRam0000000000140137,
                    CONCAT16(cRam0000000000140136,
                             CONCAT15(cRam0000000000140135,
                                      CONCAT14(cRam0000000000140134,
                                               CONCAT13(cRam0000000000140133,
                                                        CONCAT12(cRam0000000000140132,
                                                                 CONCAT11(cRam0000000000140131,
                                                                          std::
                                                  __throw_bad_array_new_length)))))));
  p_Var4[1]._M_next =
       (_List_node_base *)
       CONCAT17(cRam000000000014012f,
                CONCAT16(cRam000000000014012e,
                         CONCAT15(cRam000000000014012d,
                                  CONCAT14(cRam000000000014012c,
                                           CONCAT13(cRam000000000014012b,
                                                    CONCAT12(cRam000000000014012a,
                                                             CONCAT11(cRam0000000000140129,
                                                                      in6addr_loopback)))))));
  p_Var4[1]._M_prev = p_Var3;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(this->localIPs).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void RTPUDPv6Transmitter::AddLoopbackAddress()
{
	std::list<in6_addr>::const_iterator it;
	bool found = false;

	for (it = localIPs.begin() ; !found && it != localIPs.end() ; it++)
	{
		if ((*it) == in6addr_loopback)
			found = true;
	}

	if (!found)
		localIPs.push_back(in6addr_loopback);
}